

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void AnalyzeFunctionDefinitionArguments
               (ExpressionContext *ctx,IntrusiveList<SynFunctionArgument> arguments,
               TypeBase *parentType,TypeFunction *instance,SmallArray<ArgumentData,_8U> *argData)

{
  bool bVar1;
  uint uniqueId;
  SynIdentifier *pSVar2;
  ArgumentData *pAVar3;
  ExpressionContext *pEVar4;
  int iVar5;
  TypeHandle *in_RAX;
  ExprBase *pEVar6;
  undefined4 extraout_var;
  TypeBase *pTVar7;
  bool *failed_00;
  char *msg;
  uint uVar8;
  SynFunctionArgument *source;
  SynBase *source_00;
  SynFunctionArgument *source_01;
  bool failed;
  uint local_64;
  SynFunctionArgument *local_60;
  TypeFunction *local_58;
  ExprBase *local_50;
  TypeHandle *local_48;
  ExpressionContext *local_40;
  SynFunctionArgument *local_38;
  
  source = arguments.head;
  if (instance == (TypeFunction *)0x0) {
    local_48 = (TypeHandle *)0x0;
  }
  else {
    in_RAX = (instance->arguments).head;
    local_48 = in_RAX;
  }
  if (parentType == (TypeBase *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),parentType->isGeneric);
  }
  local_60 = source;
  local_58 = instance;
  local_40 = ctx;
  if (source != (SynFunctionArgument *)0x0) {
    do {
      pEVar4 = local_40;
      if (source->initializer == (SynBase *)0x0) {
        pEVar6 = (ExprBase *)0x0;
      }
      else {
        pEVar6 = AnalyzeExpression(local_40,source->initializer);
      }
      local_38 = source;
      if (instance == (TypeFunction *)0x0) {
        local_50 = pEVar6;
        ExpressionContext::PushTemporaryScope(pEVar4);
        if (source != local_60) {
          uVar8 = 0;
          source_01 = local_60;
          do {
            pEVar4 = local_40;
            if (argData->count <= uVar8) {
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x199,
                            "T &SmallArray<ArgumentData, 8>::operator[](unsigned int) [T = ArgumentData, N = 8]"
                           );
            }
            pAVar3 = argData->data;
            iVar5 = (*local_40->allocator->_vptr_Allocator[2])(local_40->allocator,0x170);
            pSVar2 = pAVar3[uVar8].name;
            pTVar7 = pAVar3[uVar8].type;
            uniqueId = pEVar4->uniqueVariableId;
            pEVar4->uniqueVariableId = uniqueId + 1;
            VariableData::VariableData
                      ((VariableData *)CONCAT44(extraout_var,iVar5),pEVar4->allocator,
                       &source_01->super_SynBase,pEVar4->scope,0,pTVar7,pSVar2,0,uniqueId);
            ExpressionContext::AddVariable(pEVar4,(VariableData *)CONCAT44(extraout_var,iVar5),true)
            ;
            source_01 = (SynFunctionArgument *)(source_01->super_SynBase).next;
            source = local_38;
          } while (((source_01 != (SynFunctionArgument *)0x0) &&
                   ((source_01->super_SynBase).typeID == 0x36)) &&
                  (uVar8 = uVar8 + 1, source_01 != local_38));
        }
        pEVar4 = local_40;
        failed = false;
        failed_00 = (bool *)0x0;
        if ((local_64 & 1) != 0) {
          failed_00 = &failed;
        }
        pTVar7 = AnalyzeType(local_40,source->type,true,failed_00);
        instance = local_58;
        if (pTVar7 == pEVar4->typeAuto) {
          if (local_50 == (ExprBase *)0x0) {
            source_00 = source->type;
            msg = "ERROR: function argument cannot be an auto type";
            goto LAB_00179b47;
          }
          pEVar6 = ResolveInitializerValue(pEVar4,&source->super_SynBase,local_50);
          pTVar7 = pEVar6->type;
          instance = local_58;
        }
        else if (local_50 == (ExprBase *)0x0) {
          pEVar6 = (ExprBase *)0x0;
        }
        else {
          pEVar6 = local_50;
          if (((local_50->type == (TypeBase *)0x0) || (local_50->type->typeID != 0)) &&
             ((pTVar7->isGeneric == false && (pTVar7->typeID != 0)))) {
            CreateCast(pEVar4,source->type,local_50,pTVar7,true);
            pEVar6 = local_50;
          }
        }
        if (pTVar7 == pEVar4->typeVoid) {
          source_00 = source->type;
          msg = "ERROR: function argument cannot be a void type";
LAB_00179b47:
          anon_unknown.dwarf_c3752::Stop(pEVar4,source_00,msg);
        }
        local_64 = CONCAT31((int3)(local_64 >> 8),(byte)local_64 | pTVar7->isGeneric);
        ExpressionContext::PopScope(pEVar4,SCOPE_TEMPORARY,true);
      }
      else {
        pTVar7 = local_48->type;
        local_48 = local_48->next;
      }
      bVar1 = (bool)(source->super_SynBase).field_0x3a;
      pSVar2 = source->name;
      if (argData->count == argData->max) {
        SmallArray<ArgumentData,_8U>::grow(argData,argData->count);
      }
      pAVar3 = argData->data;
      if (pAVar3 == (ArgumentData *)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<ArgumentData, 8>::push_back(const T &) [T = ArgumentData, N = 8]"
                     );
      }
      uVar8 = argData->count;
      argData->count = uVar8 + 1;
      pAVar3[uVar8].source = &local_38->super_SynBase;
      pAVar3[uVar8].isExplicit = bVar1;
      pAVar3[uVar8].name = pSVar2;
      pAVar3[uVar8].type = pTVar7;
      pAVar3[uVar8].value = pEVar6;
      pAVar3[uVar8].valueFunction = (FunctionData *)0x0;
      source = (SynFunctionArgument *)(local_38->super_SynBase).next;
    } while ((source != (SynFunctionArgument *)0x0) && ((source->super_SynBase).typeID == 0x36));
  }
  return;
}

Assistant:

void AnalyzeFunctionDefinitionArguments(ExpressionContext &ctx, IntrusiveList<SynFunctionArgument> arguments, TypeBase *parentType, TypeFunction *instance, SmallArray<ArgumentData, 8> &argData)
{
	TypeHandle *instanceArg = instance ? instance->arguments.head : NULL;

	bool hadGenericArgument = parentType ? parentType->isGeneric : false;

	for(SynFunctionArgument *argument = arguments.head; argument; argument = getType<SynFunctionArgument>(argument->next))
	{
		ExprBase *initializer = argument->initializer ? AnalyzeExpression(ctx, argument->initializer) : NULL;

		TypeBase *type = NULL;

		if(instance)
		{
			type = instanceArg->type;

			instanceArg = instanceArg->next;
		}
		else
		{
			// Create temporary scope with known arguments for reference in type expression
			ctx.PushTemporaryScope();

			unsigned pos = 0;

			for(SynFunctionArgument *prevArg = arguments.head; prevArg && prevArg != argument; prevArg = getType<SynFunctionArgument>(prevArg->next))
			{
				ArgumentData &data = argData[pos++];

				ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, prevArg, ctx.scope, 0, data.type, data.name, 0, ctx.uniqueVariableId++), true);
			}

			bool failed = false;
			type = AnalyzeType(ctx, argument->type, true, hadGenericArgument ? &failed : NULL);

			if(type == ctx.typeAuto)
			{
				if(!initializer)
					Stop(ctx, argument->type, "ERROR: function argument cannot be an auto type");

				initializer = ResolveInitializerValue(ctx, argument, initializer);

				type = initializer->type;
			}
			else if(initializer && !isType<TypeError>(initializer->type))
			{
				// Just a test
				if(!type->isGeneric && !isType<TypeError>(type))
					CreateCast(ctx, argument->type, initializer, type, true);
			}

			if(type == ctx.typeVoid)
				Stop(ctx, argument->type, "ERROR: function argument cannot be a void type");

			hadGenericArgument |= type->isGeneric;

			// Remove temporary scope
			ctx.PopScope(SCOPE_TEMPORARY);
		}

		argData.push_back(ArgumentData(argument, argument->isExplicit, argument->name, type, initializer));
	}
}